

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::skipElementsBySomeUnits
          (UCharsTrieBuilder *this,int32_t i,int32_t unitIndex,int32_t count)

{
  UChar UVar1;
  UChar UVar2;
  int local_1c;
  UChar unit;
  int32_t count_local;
  int32_t unitIndex_local;
  int32_t i_local;
  UCharsTrieBuilder *this_local;
  
  local_1c = count;
  count_local = i;
  do {
    UVar1 = UCharsTrieElement::charAt(this->elements + count_local,unitIndex,&this->strings);
    do {
      count_local = count_local + 1;
      UVar2 = UCharsTrieElement::charAt(this->elements + count_local,unitIndex,&this->strings);
    } while (UVar1 == UVar2);
    local_1c = local_1c + -1;
  } while (0 < local_1c);
  return count_local;
}

Assistant:

int32_t
UCharsTrieBuilder::skipElementsBySomeUnits(int32_t i, int32_t unitIndex, int32_t count) const {
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
    } while(--count>0);
    return i;
}